

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_reverse(lua_State *L)

{
  lua_State *L_00;
  undefined8 in_RDI;
  lua_State *unaff_retaddr;
  GCstr *s;
  SBuf *in_stack_ffffffffffffffe8;
  
  L_00 = (lua_State *)lj_lib_checkstr(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  lj_str_needbuf(L_00,in_stack_ffffffffffffffe8,0);
  return 0;
}

Assistant:

LJLIB_ASM(string_reverse)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  lj_str_needbuf(L, &G(L)->tmpbuf, s->len);
  return FFH_RETRY;
}